

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

void alcSetError(ALCdevice *device,ALCenum errorCode)

{
  uint in_ESI;
  long in_RDI;
  memory_order __b_1;
  memory_order __b;
  
  if (1 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Error generated on device %p, code 0x%04x\n",in_RDI,
            (ulong)in_ESI);
  }
  if (((anonymous_namespace)::TrapALCError & 1) != 0) {
    raise(5);
  }
  if (in_RDI == 0) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    UNLOCK();
    (anonymous_namespace)::LastNullDeviceError = in_ESI;
  }
  else {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    *(uint *)(in_RDI + 0x8c) = in_ESI;
    UNLOCK();
  }
  return;
}

Assistant:

static void alcSetError(ALCdevice *device, ALCenum errorCode)
{
    WARN("Error generated on device %p, code 0x%04x\n", decltype(std::declval<void*>()){device},
        errorCode);
    if(TrapALCError)
    {
#ifdef _WIN32
        /* DebugBreak() will cause an exception if there is no debugger */
        if(IsDebuggerPresent())
            DebugBreak();
#elif defined(SIGTRAP)
        raise(SIGTRAP);
#endif
    }

    if(device)
        device->LastError.store(errorCode);
    else
        LastNullDeviceError.store(errorCode);
}